

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ly_ctx_unset_searchdir_last(ly_ctx *ctx,uint32_t count)

{
  LY_ERR LVar1;
  bool bVar2;
  uint32_t local_1c;
  LY_ERR ret__;
  uint32_t count_local;
  ly_ctx *ctx_local;
  
  local_1c = count;
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_unset_searchdir_last");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (local_1c != 0) {
        bVar2 = (ctx->search_paths).count != 0;
      }
      if (!bVar2) break;
      LVar1 = ly_set_rm_index(&ctx->search_paths,(ctx->search_paths).count - 1,free);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      local_1c = local_1c - 1;
    }
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_unset_searchdir_last(struct ly_ctx *ctx, uint32_t count)
{
    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);

    for ( ; count > 0 && ctx->search_paths.count; --count) {
        LY_CHECK_RET(ly_set_rm_index(&ctx->search_paths, ctx->search_paths.count - 1, free))
    }

    return LY_SUCCESS;
}